

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void parse_ymd_args(int argofs,int argc,int32_t *dayno,int32_t *daytime)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  undefined4 in_register_00000034;
  int32_t *dayno_00;
  double dVar5;
  double dVar6;
  caldate_t cd;
  caldate_t local_3c;
  
  dayno_00 = (int32_t *)CONCAT44(in_register_00000034,argc);
  iVar1 = vm_val_t::num_to_int(sp_ + -1);
  iVar2 = vm_val_t::num_to_int(sp_ + -2);
  local_3c.d = vm_val_t::num_to_int(sp_ + -3);
  local_3c.y = iVar1;
  local_3c.m = iVar2;
  iVar1 = caldate_t::dayno(&local_3c);
  *dayno_00 = iVar1;
  *dayno = 0;
  if (argofs == 7) {
    iVar1 = vm_val_t::num_to_int(sp_ + -4);
    iVar2 = vm_val_t::num_to_int(sp_ + -5);
    iVar3 = vm_val_t::num_to_int(sp_ + -6);
    iVar4 = vm_val_t::num_to_int(sp_ + -7);
    dVar5 = (double)iVar4 +
            (double)iVar3 * 1000.0 +
            (double)iVar1 * 60.0 * 60.0 * 1000.0 + (double)iVar2 * 60.0 * 1000.0;
    dVar6 = floor(dVar5 / 86400000.0);
    dVar5 = fmod(dVar5,86400000.0);
    dVar6 = (double)*dayno_00 + dVar6;
    if ((dVar6 < -2147483648.0) || (2147483647.0 < dVar6)) {
      err_throw(0x7e7);
    }
    *dayno_00 = (int)dVar6;
    *dayno = (int)dVar5;
  }
  caldate_t::normalize(dayno_00,dayno);
  return;
}

Assistant:

static void parse_ymd_args(VMG_ int argofs, int argc,
                           int32_t &dayno, int32_t &daytime)
{
    /* get the year, month, and day */
    int32_t y = G_stk->get(argofs + 0)->num_to_int(vmg0_);
    int32_t m = G_stk->get(argofs + 1)->num_to_int(vmg0_);
    int32_t d = G_stk->get(argofs + 2)->num_to_int(vmg0_);

    /* figure the day number for the given calendar date */
    caldate_t cd(y, m, d);
    dayno = cd.dayno();
    
    /* 
     *   if this is the 7-argument version, get the time; otherwise it's
     *   implicitly midnight on the given date
     */
    daytime = 0;
    if (argc == 7)
    {
        /* get the hour and minute as integers, and seconds */
        int hh = G_stk->get(argofs + 3)->num_to_int(vmg0_);
        int mm = G_stk->get(argofs + 4)->num_to_int(vmg0_);
        int ss = G_stk->get(argofs + 5)->num_to_int(vmg0_);
        int ms = G_stk->get(argofs + 6)->num_to_int(vmg0_);
        
        /* 
         *   Combine the time components into 'daytime' in milliseconds.
         *   This could be a very large number, so work in double until we
         *   can normalize it.  Note that we're working in whole numbers only
         *   (no fractions), so a double will be exact - all we're worried
         *   about here is the extra integer precision it can hold, not the
         *   fractional part.
         */
        double dt = hh*60.*60.*1000. + mm*60.*1000. + ss*1000. + ms;

        /* figure the overflow into the day number (and make sure it fits) */
        double dd = floor(dt / (24.*60.*60.*1000.));
        dt = fmod(dt, 24.*60.*60.*1000.);

        /* apply the overflow to the day number, and make sure it fits */
        dd += dayno;
        if (dd < INT32MINVAL || dd > INT32MAXVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* it's all normalized and in range, so convert back to int32 */
        dayno = (int32_t)dd;
        daytime = (int32_t)dt;
    }

    /* normalize the result */
    caldate_t::normalize(dayno, daytime);
}